

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O3

bool __thiscall hwtest::pgraph::MthdEmuEmuD3D0TexFormat::is_valid_val(MthdEmuEmuD3D0TexFormat *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((uVar1 & 0xce0000) != 0) {
    return false;
  }
  uVar2 = uVar1 >> 0x18 & 0xf;
  return (uVar1 < 0xc0000000 && 1 < uVar2) && uVar2 <= uVar1 >> 0x1c;
}

Assistant:

bool is_valid_val() override {
		if (val & ~0xff31ffff)
			return false;
		int max_l = extr(val, 28, 4);
		int min_l = extr(val, 24, 4);
		if (min_l < 2)
			return false;
		if (min_l > max_l)
			return false;
		if (max_l > 0xb)
			return false;
		return true;
	}